

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv.c
# Opt level: O0

void nsync::nsync_cv_broadcast(nsync_cv *pcv)

{
  void *pvVar1;
  uint uVar2;
  int iVar3;
  nsync_dll_element_ *pnVar4;
  nsync_dll_list_ pnVar5;
  bool local_3d;
  uint32_t old_value;
  nsync_waiter_s *p_nw;
  nsync_dll_list_ to_wake_list;
  int all_readers;
  nsync_dll_element_ *next;
  nsync_dll_element_ *p;
  nsync_cv *pcv_local;
  
  uVar2 = std::atomic_load_explicit<unsigned_int>(&pcv->word,memory_order_acquire);
  if ((uVar2 & 2) != 0) {
    p_nw = (nsync_waiter_s *)0x0;
    nsync_spin_test_and_set_(&pcv->word,1,1,0);
    to_wake_list._4_4_ = 1;
    next = nsync_dll_first_(pcv->waiters);
    while (next != (nsync_dll_element_ *)0x0) {
      pvVar1 = next->container;
      pnVar4 = nsync_dll_next_(pcv->waiters,next);
      local_3d = false;
      if ((to_wake_list._4_4_ != 0) && (local_3d = false, (*(uint *)((long)pvVar1 + 0x30) & 1) != 0)
         ) {
        local_3d = *(undefined **)((long)next->container + 0x40) == nsync_reader_type_;
      }
      to_wake_list._4_4_ = (uint)local_3d;
      pnVar5 = nsync_dll_remove_(pcv->waiters,next);
      pcv->waiters = pnVar5;
      if ((*(uint *)((long)pvVar1 + 0x30) & 1) != 0) {
        do {
          uVar2 = std::atomic_load_explicit<unsigned_int>
                            ((atomic<unsigned_int> *)((long)next->container + 0x48),
                             memory_order_relaxed);
          iVar3 = atm_cas_nomb_u32_((nsync_atomic_uint32_ *)((long)next->container + 0x48),uVar2,
                                    uVar2 + 1);
        } while (iVar3 == 0);
      }
      p_nw = (nsync_waiter_s *)nsync_dll_make_last_in_list_((nsync_dll_list_)p_nw,next);
      next = pnVar4;
    }
    std::atomic_store_explicit<unsigned_int>(&pcv->word,0,memory_order_release);
    iVar3 = nsync_dll_is_empty_((nsync_dll_list_)p_nw);
    if (iVar3 == 0) {
      wake_waiters((nsync_dll_list_)p_nw,to_wake_list._4_4_);
    }
  }
  return;
}

Assistant:

void nsync_cv_broadcast (nsync_cv *pcv) {
	IGNORE_RACES_START ();
	if ((ATM_LOAD_ACQ (&pcv->word) & CV_NON_EMPTY) != 0) { /* acquire load */
		nsync_dll_element_ *p;
		nsync_dll_element_ *next;
		int all_readers;
		nsync_dll_list_ to_wake_list = NULL;   /* waiters that we will wake */
		/* acquire spinlock */
		nsync_spin_test_and_set_ (&pcv->word, CV_SPINLOCK, CV_SPINLOCK, 0);
		p = NULL;
		next = NULL;
		all_readers = 1;
		/* Wake entire waiter list, which we leave empty. */
		for (p = nsync_dll_first_ (pcv->waiters); p != NULL; p = next) {
			struct nsync_waiter_s *p_nw = DLL_NSYNC_WAITER (p);
			next = nsync_dll_next_ (pcv->waiters, p);
			all_readers = all_readers && (p_nw->flags & NSYNC_WAITER_FLAG_MUCV) != 0 &&
				      (DLL_WAITER (p)->l_type == nsync_reader_type_);
			pcv->waiters = nsync_dll_remove_ (pcv->waiters, p);
			if ((p_nw->flags & NSYNC_WAITER_FLAG_MUCV) != 0) {
				uint32_t old_value;
				do {    
					old_value = ATM_LOAD (&DLL_WAITER (p)->remove_count);
				} while (!ATM_CAS (&DLL_WAITER (p)->remove_count,
						   old_value, old_value+1));
			}
			to_wake_list = nsync_dll_make_last_in_list_ (to_wake_list, p);
		}
		/* Release spinlock and mark queue empty. */
		ATM_STORE_REL (&pcv->word, 0); /* release store */
		if (!nsync_dll_is_empty_ (to_wake_list)) {    /* Wake them. */
			wake_waiters (to_wake_list, all_readers);
		}
	}
	IGNORE_RACES_END ();
}